

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.cpp
# Opt level: O1

bool spvOperandIsOptional(spv_operand_type_t type)

{
  if ((type - SPV_OPERAND_TYPE_FIRST_OPTIONAL_TYPE < 0x2e) &&
     ((0x2014000003ffU >> ((ulong)(type - SPV_OPERAND_TYPE_FIRST_OPTIONAL_TYPE) & 0x3f) & 1) != 0))
  {
    return true;
  }
  return (type & ~SPV_OPERAND_TYPE_RESULT_ID) == SPV_OPERAND_TYPE_FIRST_VARIABLE_TYPE;
}

Assistant:

bool spvOperandIsOptional(spv_operand_type_t type) {
  switch (type) {
    case SPV_OPERAND_TYPE_OPTIONAL_ID:
    case SPV_OPERAND_TYPE_OPTIONAL_IMAGE:
    case SPV_OPERAND_TYPE_OPTIONAL_MEMORY_ACCESS:
    case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_INTEGER:
    case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_NUMBER:
    case SPV_OPERAND_TYPE_OPTIONAL_TYPED_LITERAL_INTEGER:
    case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_STRING:
    case SPV_OPERAND_TYPE_OPTIONAL_ACCESS_QUALIFIER:
    case SPV_OPERAND_TYPE_OPTIONAL_PACKED_VECTOR_FORMAT:
    case SPV_OPERAND_TYPE_OPTIONAL_COOPERATIVE_MATRIX_OPERANDS:
    case SPV_OPERAND_TYPE_OPTIONAL_CIV:
    case SPV_OPERAND_TYPE_OPTIONAL_RAW_ACCESS_CHAIN_OPERANDS:
    case SPV_OPERAND_TYPE_OPTIONAL_FPENCODING:
      return true;
    default:
      break;
  }
  // Any variable operand is also optional.
  return spvOperandIsVariable(type);
}